

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatTerm.cpp
# Opt level: O0

FlatTerm * Kernel::FlatTerm::createUnexpanded(TermStack *ts)

{
  bool bVar1;
  TermList *pTVar2;
  FlatTerm *this;
  Term *this_00;
  size_t sVar3;
  Stack<Kernel::TermList> *in_RDI;
  Term *t;
  TermList *tl_1;
  TermList *__end1_1;
  TermList *__begin1_1;
  TermStack *__range1_1;
  size_t fti;
  FlatTerm *res;
  TermList *tl;
  TermList *__end1;
  TermList *__begin1;
  TermStack *__range1;
  size_t entries;
  uint in_stack_ffffffffffffff58;
  EntryTag in_stack_ffffffffffffff5c;
  TermList *in_stack_ffffffffffffff60;
  FlatTerm *this_01;
  Term *in_stack_ffffffffffffff68;
  uint64_t local_88;
  uint64_t local_80;
  uint64_t local_78;
  uint64_t local_68;
  TermList *local_50;
  long local_40;
  TermList *local_20;
  size_t local_10;
  
  local_10 = 0;
  local_20 = Lib::Stack<Kernel::TermList>::begin(in_RDI);
  pTVar2 = Lib::Stack<Kernel::TermList>::end(in_RDI);
  for (; local_20 != pTVar2; local_20 = local_20 + 1) {
    bVar1 = TermList::isVar(in_stack_ffffffffffffff60);
    if (bVar1) {
      in_stack_ffffffffffffff68 = (Term *)0x1;
    }
    else {
      TermList::term((TermList *)0x8542b7);
      in_stack_ffffffffffffff68 = (Term *)getEntryCount(in_stack_ffffffffffffff68);
    }
    local_10 = (long)&((Term *)(in_stack_ffffffffffffff68->_args + -5))->_vptr_Term + local_10;
  }
  this = (FlatTerm *)operator_new((size_t)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  FlatTerm(this,local_10);
  local_40 = 0;
  this_01 = this;
  local_50 = Lib::Stack<Kernel::TermList>::begin(in_RDI);
  pTVar2 = Lib::Stack<Kernel::TermList>::end(in_RDI);
  for (; local_50 != pTVar2; local_50 = local_50 + 1) {
    bVar1 = TermList::isVar((TermList *)this_01);
    if (bVar1) {
      TermList::var(local_50);
      Entry::Entry((Entry *)this_01,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
      this->_data[local_40]._content = local_68;
      local_40 = local_40 + 1;
    }
    else {
      this_00 = TermList::term((TermList *)0x8543c7);
      bVar1 = Term::isLiteral((Term *)0x8543d6);
      if (bVar1) {
        in_stack_ffffffffffffff5c = Literal::header((Literal *)this_01);
      }
      else {
        in_stack_ffffffffffffff5c = Term::functor(this_00);
      }
      Entry::Entry((Entry *)this_01,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
      this->_data[local_40]._content = local_78;
      Entry::Entry((Entry *)this_01,
                   (Term *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      this[1]._data[local_40 + -1]._content = local_80;
      getEntryCount(in_stack_ffffffffffffff68);
      Entry::Entry((Entry *)this_01,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
      this[1]._data[local_40]._content = local_88;
      sVar3 = getEntryCount(in_stack_ffffffffffffff68);
      local_40 = sVar3 + local_40;
    }
  }
  return this;
}

Assistant:

FlatTerm* FlatTerm::createUnexpanded(TermStack ts)
{
  size_t entries=0;
  for (auto& tl : ts) {
    entries += tl.isVar() ? 1 : getEntryCount(tl.term());
  }

  FlatTerm* res=new(entries) FlatTerm(entries);
  size_t fti=0;

  for (auto& tl : ts) {
    if (tl.isVar()) {
      res->_data[fti++]=Entry(VAR, tl.var());
      continue;
    }
    auto t = tl.term();
    res->_data[fti]=Entry(FUN_UNEXPANDED,
        t->isLiteral() ? static_cast<Literal*>(t)->header() : t->functor());
    res->_data[fti+1]=Entry(t);
    res->_data[fti+2]=Entry(FUN_RIGHT_OFS, getEntryCount(t));
    fti+=getEntryCount(t);
  }
  ASS_EQ(fti, entries);

  return res;
}